

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::ServiceOptions::ByteSizeLong(ServiceOptions *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ServiceOptions *in_RDI;
  int cached_size;
  UninterpretedOption *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *__range2;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  reference in_stack_ffffffffffffffa0;
  iterator local_58;
  RepeatedPtrIterator<const_google::protobuf::UninterpretedOption> local_50;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *local_48;
  uint local_3c;
  size_t local_38;
  size_t local_28;
  InternalMetadataWithArena *local_20;
  undefined4 local_14;
  HasBits<1UL> *local_10;
  InternalMetadataWithArena *local_8;
  
  local_38 = 0;
  sVar3 = internal::ExtensionSet::ByteSize((ExtensionSet *)in_stack_ffffffffffffffa0);
  local_38 = sVar3 + local_38;
  local_3c = 0;
  iVar2 = _internal_uninterpreted_option_size((ServiceOptions *)0x510011);
  local_38 = (long)iVar2 * 2 + local_38;
  local_48 = &in_RDI->uninterpreted_option_;
  local_50.it_ = (void **)RepeatedPtrField<google::protobuf::UninterpretedOption>::begin
                                    ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_58.it_ = (void **)RepeatedPtrField<google::protobuf::UninterpretedOption>::end
                                    ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator!=
                      (&local_50,&local_58);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 =
         internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator*
                   (&local_50);
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      ((UninterpretedOption *)0x51007d);
    local_38 = sVar3 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator++
              (&local_50);
  }
  local_10 = &in_RDI->_has_bits_;
  local_14 = 0;
  local_3c = local_10->has_bits_[0];
  if ((local_3c & 1) != 0) {
    local_38 = local_38 + 3;
  }
  local_20 = &in_RDI->_internal_metadata_;
  local_8 = local_20;
  if (((uint)(local_20->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)in_stack_ffffffffffffffa0,
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          (CachedSize *)in_RDI);
  }
  else {
    internal::ToCachedSize(local_38);
    SetCachedSize(in_RDI,in_stack_ffffffffffffff8c);
    local_28 = local_38;
  }
  return local_28;
}

Assistant:

size_t ServiceOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // optional bool deprecated = 33 [default = false];
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    total_size += 2 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}